

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDwaLookups.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_29c88c::LutHeaderWorker::LutHeaderWorker
          (LutHeaderWorker *this,size_t startValue,size_t endValue)

{
  size_t *psVar1;
  unsigned_short *puVar2;
  
  this->_lastCandidateCount = 0;
  this->_startValue = startValue;
  this->_endValue = endValue;
  this->_numElements = 0;
  psVar1 = (size_t *)
           operator_new__(-(ulong)(endValue - startValue >> 0x3d != 0) | (endValue - startValue) * 8
                         );
  this->_offset = psVar1;
  puVar2 = (unsigned_short *)operator_new__(0x400000);
  this->_elements = puVar2;
  return;
}

Assistant:

LutHeaderWorker(size_t startValue,
                    size_t endValue):
        _lastCandidateCount(0),
        _startValue(startValue),
        _endValue(endValue),
        _numElements(0),
        _offset(new size_t[numValues()]),
        _elements(new unsigned short[1024*1024*2])
    {
    }